

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

void __thiscall ScapeGoatTree::caseC(ScapeGoatTree *this,Node *par,Node *loc)

{
  Node *parSuc;
  Node *suc;
  Node *ptrSave;
  Node *ptr;
  Node *loc_local;
  Node *par_local;
  ScapeGoatTree *this_local;
  
  suc = loc;
  for (ptrSave = loc->rightChild; ptrSave->leftChild != (Node *)0x0; ptrSave = ptrSave->leftChild) {
    suc = ptrSave;
  }
  if ((ptrSave->leftChild == (Node *)0x0) && (ptrSave->rightChild == (Node *)0x0)) {
    caseA(this,suc,ptrSave);
  }
  else {
    caseB(this,suc,ptrSave);
  }
  if (par == (Node *)0x0) {
    this->root = ptrSave;
  }
  else if (loc == par->leftChild) {
    par->leftChild = ptrSave;
  }
  else {
    par->rightChild = ptrSave;
  }
  ptrSave->leftChild = loc->leftChild;
  ptrSave->rightChild = loc->rightChild;
  return;
}

Assistant:

void ScapeGoatTree::caseC(Node *par, Node *loc) {
    Node *ptr, *ptrSave, *suc, *parSuc;
    ptrSave = loc;
    ptr = loc->rightChild;
    while (ptr->leftChild != nullptr) {
        ptrSave = ptr;
        ptr = ptr->leftChild;
    }
    suc = ptr;
    parSuc = ptrSave;
    if (suc->leftChild == nullptr && suc->rightChild == nullptr) {
        caseA(parSuc, suc);
    } else {
        caseB(parSuc, suc);
    }
    if (par == nullptr) {
        root = suc;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = suc;
        } else {
            par->rightChild = suc;
        }
    }
    suc->leftChild = loc->leftChild;
    suc->rightChild = loc->rightChild;
}